

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Parser::Parser(Parser *this)

{
  Parser *this_local;
  
  this->input_ = (Tokenizer *)0x0;
  this->error_collector_ = (ErrorCollector *)0x0;
  this->source_location_table_ = (SourceLocationTable *)0x0;
  this->had_errors_ = false;
  this->require_syntax_identifier_ = false;
  this->stop_after_syntax_identifier_ = false;
  std::__cxx11::string::string((string *)&this->syntax_identifier_);
  std::__cxx11::string::string((string *)&this->upcoming_doc_comments_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->upcoming_detached_comments_);
  return;
}

Assistant:

Parser::Parser()
  : input_(NULL),
    error_collector_(NULL),
    source_location_table_(NULL),
    had_errors_(false),
    require_syntax_identifier_(false),
    stop_after_syntax_identifier_(false) {
}